

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLatch.c
# Opt level: O2

int Abc_NtkVerifyCex(Abc_Ntk_t *pNtk,Abc_Cex_t *p)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  int *piVar4;
  void **ppvVar5;
  Abc_Obj_t *pAVar6;
  int iVar7;
  int i;
  int iVar8;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcLatch.c"
                  ,0x2df,"int Abc_NtkVerifyCex(Abc_Ntk_t *, Abc_Cex_t *)");
  }
  if (p->nPis == pNtk->vPis->nSize) {
    Abc_NtkCleanMarkC(pNtk);
    pAVar6 = Abc_AigConst1(pNtk);
    pAVar6->field_0x14 = pAVar6->field_0x14 | 0x40;
    iVar8 = 0;
    for (iVar7 = 0; iVar7 < pNtk->vBoxes->nSize; iVar7 = iVar7 + 1) {
      pAVar6 = Abc_NtkBox(pNtk,iVar7);
      if ((*(uint *)&pAVar6->field_0x14 & 0xf) == 8) {
        pvVar3 = pAVar6->pNtk->vObjs->pArray[*(pAVar6->vFanouts).pArray];
        *(uint *)((long)pvVar3 + 0x14) =
             *(uint *)((long)pvVar3 + 0x14) & 0xffffffbf |
             ((uint)(&p[1].iPo)[iVar8 >> 5] >> ((byte)iVar8 & 0x1f) & 1) << 6;
        iVar8 = iVar8 + 1;
      }
    }
    iVar8 = p->nRegs;
    for (iVar7 = 0; iVar7 <= p->iFrame; iVar7 = iVar7 + 1) {
      for (i = 0; iVar1 = i + iVar8, i < pNtk->vPis->nSize; i = i + 1) {
        pAVar6 = Abc_NtkPi(pNtk,i);
        *(uint *)&pAVar6->field_0x14 =
             *(uint *)&pAVar6->field_0x14 & 0xffffffbf |
             ((uint)(&p[1].iPo)[iVar1 >> 5] >> ((byte)iVar1 & 0x1f) & 1) << 6;
      }
      for (iVar8 = 0; iVar8 < pNtk->vObjs->nSize; iVar8 = iVar8 + 1) {
        pAVar6 = Abc_NtkObj(pNtk,iVar8);
        if ((pAVar6 != (Abc_Obj_t *)0x0) &&
           (uVar2 = *(uint *)&pAVar6->field_0x14, (uVar2 & 0xf) == 7)) {
          piVar4 = (pAVar6->vFanins).pArray;
          ppvVar5 = pAVar6->pNtk->vObjs->pArray;
          *(uint *)&pAVar6->field_0x14 =
               uVar2 & 0xffffffb7 |
               ((uVar2 >> 0xb ^ *(uint *)((long)ppvVar5[piVar4[1]] + 0x14) >> 6) &
                (uVar2 >> 10 ^ *(uint *)((long)ppvVar5[*piVar4] + 0x14) >> 6) & 1) << 6;
        }
      }
      for (iVar8 = 0; iVar8 < pNtk->vCos->nSize; iVar8 = iVar8 + 1) {
        pAVar6 = Abc_NtkCo(pNtk,iVar8);
        *(uint *)&pAVar6->field_0x14 =
             *(uint *)&pAVar6->field_0x14 & 0xffffffbf |
             (*(uint *)&pAVar6->field_0x14 >> 4 ^
             *(uint *)((long)pAVar6->pNtk->vObjs->pArray[*(pAVar6->vFanins).pArray] + 0x14)) & 0x40;
      }
      for (iVar8 = 0; iVar8 < pNtk->vBoxes->nSize; iVar8 = iVar8 + 1) {
        pAVar6 = Abc_NtkBox(pNtk,iVar8);
        if ((*(uint *)&pAVar6->field_0x14 & 0xf) == 8) {
          ppvVar5 = pAVar6->pNtk->vObjs->pArray;
          pvVar3 = ppvVar5[*(pAVar6->vFanouts).pArray];
          *(uint *)((long)pvVar3 + 0x14) =
               *(uint *)((long)pvVar3 + 0x14) & 0xffffffbf |
               *(uint *)((long)ppvVar5[*(pAVar6->vFanins).pArray] + 0x14) & 0x40;
        }
      }
      iVar8 = iVar1;
    }
    if (iVar8 == p->nBits) {
      iVar8 = 0;
      while ((iVar7 = -1, iVar8 < pNtk->vPos->nSize &&
             (pAVar6 = Abc_NtkPo(pNtk,iVar8), iVar7 = iVar8, (pAVar6->field_0x14 & 0x40) == 0))) {
        iVar8 = iVar8 + 1;
      }
      Abc_NtkCleanMarkC(pNtk);
      return iVar7;
    }
    __assert_fail("iBit == p->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcLatch.c"
                  ,0x2f5,"int Abc_NtkVerifyCex(Abc_Ntk_t *, Abc_Cex_t *)");
  }
  __assert_fail("p->nPis == Abc_NtkPiNum(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcLatch.c"
                ,0x2e0,"int Abc_NtkVerifyCex(Abc_Ntk_t *, Abc_Cex_t *)");
}

Assistant:

int Abc_NtkVerifyCex( Abc_Ntk_t * pNtk, Abc_Cex_t * p )
{
    Abc_Obj_t * pObj;
    int RetValue, i, k, iBit = 0;
    assert( Abc_NtkIsStrash(pNtk) );
    assert( p->nPis  == Abc_NtkPiNum(pNtk) );
//    assert( p->nRegs == Abc_NtkLatchNum(pNtk) );
    Abc_NtkCleanMarkC( pNtk );
    Abc_AigConst1(pNtk)->fMarkC = 1;
    // initialize flops
    Abc_NtkForEachLatch( pNtk, pObj, i )
        Abc_ObjFanout0(pObj)->fMarkC = Abc_InfoHasBit(p->pData, iBit++);
    // simulate timeframes
    iBit = p->nRegs;
    for ( i = 0; i <= p->iFrame; i++ )
    {
        Abc_NtkForEachPi( pNtk, pObj, k )
            pObj->fMarkC = Abc_InfoHasBit(p->pData, iBit++);
        Abc_NtkForEachNode( pNtk, pObj, k )
            pObj->fMarkC = (Abc_ObjFanin0(pObj)->fMarkC ^ Abc_ObjFaninC0(pObj)) & 
                           (Abc_ObjFanin1(pObj)->fMarkC ^ Abc_ObjFaninC1(pObj));
        Abc_NtkForEachCo( pNtk, pObj, k )
            pObj->fMarkC = Abc_ObjFanin0(pObj)->fMarkC ^ Abc_ObjFaninC0(pObj);
        Abc_NtkForEachLatch( pNtk, pObj, k )
            Abc_ObjFanout0(pObj)->fMarkC = Abc_ObjFanin0(pObj)->fMarkC;
    }
    assert( iBit == p->nBits );
    // figure out the number of failed output
    RetValue = -1;
    Abc_NtkForEachPo( pNtk, pObj, i )
    {
        if ( pObj->fMarkC )
        {
            RetValue = i;
            break;
        }
    }
    Abc_NtkCleanMarkC( pNtk );
    return RetValue;
}